

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counting_list.cpp
# Opt level: O0

int main(void)

{
  _Setprecision _Var1;
  istream *piVar2;
  size_t sVar3;
  reference pvVar4;
  ostream *poVar5;
  void *pvVar6;
  double dVar7;
  double f;
  double beta;
  double t;
  size_t s;
  size_t b;
  graph lat;
  double t_step;
  double t_max;
  double t_min;
  vector<double,_std::allocator<double>_> field;
  vector<double,_std::allocator<double>_> inter;
  int Ly;
  int Lx;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe08;
  graph *in_stack_fffffffffffffe10;
  graph *in_stack_fffffffffffffe18;
  ostream *in_stack_fffffffffffffe20;
  size_type in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  size_t in_stack_fffffffffffffe50;
  size_t in_stack_fffffffffffffe58;
  size_t in_stack_fffffffffffffe68;
  size_t in_stack_fffffffffffffe88;
  double local_140;
  size_type local_130;
  size_type local_128;
  boundary_t in_stack_ffffffffffffff04;
  span_t *in_stack_ffffffffffffff08;
  unitcell *in_stack_ffffffffffffff10;
  basis *in_stack_ffffffffffffff18;
  graph *in_stack_ffffffffffffff20;
  double local_58;
  double local_50;
  double local_48;
  vector<double,_std::allocator<double>_> local_40;
  vector<double,_std::allocator<double>_> local_28;
  int local_c;
  int local_8;
  int local_4;
  
  local_4 = 0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x10248f);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x10249c);
  piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_8);
  std::istream::operator>>(piVar2,&local_c);
  lattice::basis::simple(in_stack_fffffffffffffe68);
  lattice::unitcell::simple(in_stack_fffffffffffffe88);
  lattice::extent(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  lattice::graph::graph
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
             in_stack_ffffffffffffff08,in_stack_ffffffffffffff04);
  Eigen::Matrix<long,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<long,__1,__1,_0,__1,__1> *)0x102552);
  lattice::unitcell::~unitcell((unitcell *)in_stack_fffffffffffffe10);
  lattice::basis::~basis((basis *)0x10256c);
  lattice::graph::num_bonds((graph *)0x102579);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),in_stack_fffffffffffffe28
            );
  local_128 = 0;
  while( true ) {
    sVar3 = lattice::graph::num_bonds((graph *)0x1025c3);
    if (sVar3 <= local_128) break;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_28,local_128);
    std::istream::operator>>((istream *)&std::cin,pvVar4);
    local_128 = local_128 + 1;
  }
  lattice::graph::num_sites((graph *)0x1026dc);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),in_stack_fffffffffffffe28
            );
  local_130 = 0;
  while( true ) {
    sVar3 = lattice::graph::num_sites((graph *)0x102723);
    if (sVar3 <= local_130) break;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_40,local_130);
    std::istream::operator>>((istream *)&std::cin,pvVar4);
    local_130 = local_130 + 1;
  }
  piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_48);
  piVar2 = (istream *)std::istream::operator>>(piVar2,&local_50);
  std::istream::operator>>(piVar2,&local_58);
  poVar5 = std::operator<<((ostream *)&std::cout,"# Lx = ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,local_8);
  poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"# Ly = ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,local_c);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = (ostream *)std::ostream::operator<<(&std::cout,std::scientific);
  _Var1 = std::setprecision(0xb);
  std::operator<<(poVar5,_Var1);
  for (local_140 = local_48; local_140 <= local_50; local_140 = local_58 + local_140) {
    dVar7 = ising::counting::free_energy_density<lattice::graph>
                      ((double)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                       (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe10,
                       in_stack_fffffffffffffe08);
    in_stack_fffffffffffffe20 = (ostream *)std::ostream::operator<<(&std::cout,local_140);
    in_stack_fffffffffffffe18 = (graph *)std::operator<<(in_stack_fffffffffffffe20,' ');
    in_stack_fffffffffffffe10 = (graph *)std::ostream::operator<<(in_stack_fffffffffffffe18,dVar7);
    std::ostream::operator<<(in_stack_fffffffffffffe10,std::endl<char,std::char_traits<char>>);
  }
  lattice::graph::~graph(in_stack_fffffffffffffe10);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe20);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe20);
  return local_4;
}

Assistant:

int main() {
  int Lx, Ly; // system size
  std::vector<double> inter, field;
  double t_min, t_max, t_step;

  std::cin >> Lx >> Ly;
  auto lat = lattice::graph(lattice::basis::simple(2), lattice::unitcell::simple(2), lattice::extent(Lx, Ly));
  inter.resize(lat.num_bonds());
  for (std::size_t b = 0; b < lat.num_bonds(); ++b) std::cin >> inter[b];
  field.resize(lat.num_sites());
  for (std::size_t s = 0; s < lat.num_sites(); ++s) std::cin >> field[s];
  std::cin >> t_min >> t_max >> t_step;

  std::cout << "# Lx = " << Lx <<std::endl << "# Ly = " << Ly <<std::endl;
  std::cout << std::scientific << std::setprecision(11);
  for (double t = t_min; t <= t_max; t += t_step) {
    double beta = 1 / t;
    double f = ising::counting::free_energy_density(beta, lat, inter, field);
    std::cout << t << ' ' << f << std::endl;
  }
}